

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

void __thiscall
olc::PixelGameEngine::DrawPartialWarpedDecal
          (PixelGameEngine *this,Decal *decal,vf2d *pos,vf2d *source_pos,vf2d *source_size,
          Pixel *tint)

{
  float fVar1;
  int i_1;
  ulong uVar2;
  int i;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float d [4];
  DecalInstance di;
  float local_c8 [8];
  undefined1 local_a8 [32];
  pointer local_88;
  pointer pvStack_80;
  pointer local_78;
  pointer pfStack_70;
  pointer local_68;
  pointer pfStack_60;
  pointer local_58;
  pointer pPStack_50;
  pointer local_48;
  undefined8 uStack_40;
  
  local_48 = (pointer)0x0;
  local_a8._8_8_ = (pointer)0x0;
  local_58 = (pointer)0x0;
  pPStack_50 = (pointer)0x0;
  local_68 = (pointer)0x0;
  pfStack_60 = (pointer)0x0;
  local_78 = (pointer)0x0;
  pfStack_70 = (pointer)0x0;
  local_88 = (pointer)0x0;
  pvStack_80 = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_a8._24_8_ = (pointer)0x0;
  uStack_40._0_4_ = NORMAL;
  uStack_40._4_4_ = 4;
  local_c8[1] = (float)(tint->field_0).n;
  local_c8[0] = local_c8[1];
  local_c8[3] = local_c8[1];
  local_c8[2] = local_c8[1];
  local_a8._0_8_ = decal;
  std::vector<olc::Pixel,std::allocator<olc::Pixel>>::_M_assign_aux<olc::Pixel_const*>
            ((vector<olc::Pixel,std::allocator<olc::Pixel>> *)&local_58,local_c8);
  local_c8[0] = 1.0;
  local_c8[1] = 1.0;
  local_c8[2] = 1.0;
  local_c8[3] = 1.0;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)&pfStack_70,local_c8);
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
             (local_a8 + 8),4);
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_c8[2] = 0.0;
  local_c8[3] = 1.0;
  local_c8[4] = 1.0;
  local_c8[5] = 1.0;
  local_c8[6] = 1.0;
  local_c8[7] = 0.0;
  std::vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>>::
  _M_assign_aux<olc::v2d_generic<float>const*>
            ((vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>> *)&local_88,
             local_c8);
  fVar6 = (pos[3].y - pos[1].y) * (pos[2].x - pos->x) - (pos[2].y - pos->y) * (pos[3].x - pos[1].x);
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    fVar5 = (decal->vUVScale).x;
    fVar1 = (decal->vUVScale).y;
    local_c8[0] = source_pos->x * fVar5;
    local_c8[7] = source_pos->y * fVar1;
    local_c8[4] = fVar5 * source_size->x + local_c8[0];
    local_c8[5] = fVar1 * source_size->y + local_c8[7];
    local_c8[1] = local_c8[7];
    local_c8[3] = local_c8[5];
    local_c8[2] = local_c8[0];
    local_c8[6] = local_c8[4];
    std::vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>>::
    _M_assign_aux<olc::v2d_generic<float>const*>
              ((vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>> *)&local_88,
               local_c8);
    fVar5 = pos->x;
    fVar1 = pos->y;
    fVar7 = fVar1 - pos[1].y;
    fVar9 = fVar5 - pos[1].x;
    fVar4 = ((pos[3].x - pos[1].x) * fVar7 - (pos[3].y - pos[1].y) * fVar9) * (1.0 / fVar6);
    fVar11 = 0.0;
    fVar10 = 0.0;
    if ((0.0 <= fVar4) && (fVar4 <= 1.0)) {
      fVar8 = pos[2].x - fVar5;
      fVar6 = (1.0 / fVar6) * (fVar7 * fVar8 - fVar9 * (pos[2].y - fVar1));
      fVar10 = 0.0;
      if ((0.0 <= fVar6) && (fVar6 <= 1.0)) {
        fVar11 = fVar5 + fVar8 * fVar4;
        fVar10 = (pos[2].y - fVar1) * fVar4 + fVar1;
      }
    }
    lVar3 = 0;
    do {
      fVar6 = pos[lVar3].x - fVar11;
      fVar5 = pos[lVar3].y - fVar10;
      fVar6 = fVar6 * fVar6 + fVar5 * fVar5;
      if (fVar6 < 0.0) {
        fVar6 = sqrtf(fVar6);
      }
      else {
        fVar6 = SQRT(fVar6);
      }
      local_c8[lVar3] = fVar6;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    uVar2 = 0;
    do {
      fVar6 = local_c8[uVar2];
      fVar5 = 1.0;
      if ((fVar6 != 0.0) || (NAN(fVar6))) {
        fVar5 = (fVar6 + local_c8[uVar2 ^ 2]) / local_c8[uVar2 ^ 2];
      }
      local_88[uVar2].x = local_88[uVar2].x * fVar5;
      local_88[uVar2].y = local_88[uVar2].y * fVar5;
      pfStack_70[uVar2] = fVar5 * pfStack_70[uVar2];
      fVar6 = pos[uVar2].x * (this->vInvScreenSize).x;
      fVar5 = pos[uVar2].y * (this->vInvScreenSize).y;
      ((pointer)(local_a8._8_8_ + uVar2 * 8))->x = fVar6 + fVar6 + -1.0;
      ((pointer)(local_a8._8_8_ + uVar2 * 8))->y = -(fVar5 + fVar5 + -1.0);
      uVar2 = uVar2 + 1;
    } while (uVar2 != 4);
    uStack_40._0_4_ = this->nDecalMode;
    std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
              (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
                _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
               (value_type *)local_a8);
  }
  if (local_58 != (pointer)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  if (pfStack_70 != (pointer)0x0) {
    operator_delete(pfStack_70,(long)pfStack_60 - (long)pfStack_70);
  }
  if (local_88 != (pointer)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_a8._24_8_ - local_a8._8_8_);
  }
  return;
}

Assistant:

void PixelGameEngine::DrawPartialWarpedDecal(olc::Decal *decal, const olc::vf2d *pos, const olc::vf2d &source_pos, const olc::vf2d &source_size, const olc::Pixel &tint)
	{
		DecalInstance di;
		di.points = 4;
		di.decal = decal;
		di.tint = {tint, tint, tint, tint};
		di.w = {1, 1, 1, 1};
		di.pos.resize(4);
		di.uv = {{0.0f, 0.0f}, {0.0f, 1.0f}, {1.0f, 1.0f}, {1.0f, 0.0f}};
		olc::vf2d center;
		float rd = ((pos[2].x - pos[0].x) * (pos[3].y - pos[1].y) - (pos[3].x - pos[1].x) * (pos[2].y - pos[0].y));
		if (rd != 0)
		{
			olc::vf2d uvtl = source_pos * decal->vUVScale;
			olc::vf2d uvbr = uvtl + (source_size * decal->vUVScale);
			di.uv = {{uvtl.x, uvtl.y}, {uvtl.x, uvbr.y}, {uvbr.x, uvbr.y}, {uvbr.x, uvtl.y}};

			rd = 1.0f / rd;
			float rn = ((pos[3].x - pos[1].x) * (pos[0].y - pos[1].y) - (pos[3].y - pos[1].y) * (pos[0].x - pos[1].x)) * rd;
			float sn = ((pos[2].x - pos[0].x) * (pos[0].y - pos[1].y) - (pos[2].y - pos[0].y) * (pos[0].x - pos[1].x)) * rd;
			if (!(rn < 0.f || rn > 1.f || sn < 0.f || sn > 1.f))
				center = pos[0] + rn * (pos[2] - pos[0]);
			float d[4];
			for (int i = 0; i < 4; i++)
				d[i] = (pos[i] - center).mag();
			for (int i = 0; i < 4; i++)
			{
				float q = d[i] == 0.0f ? 1.0f : (d[i] + d[(i + 2) & 3]) / d[(i + 2) & 3];
				di.uv[i] *= q;
				di.w[i] *= q;
				di.pos[i] = {(pos[i].x * vInvScreenSize.x) * 2.0f - 1.0f, ((pos[i].y * vInvScreenSize.y) * 2.0f - 1.0f) * -1.0f};
			}
			di.mode = nDecalMode;
			vLayers[nTargetLayer].vecDecalInstance.push_back(di);
		}
	}